

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::upPartials
          (BeagleCPUImpl<float,_1,_0> *this,bool byPartition,int *operations,int count,
          int cumulativeScaleIndex)

{
  int in_ECX;
  long in_RDX;
  byte in_SIL;
  long *in_RDI;
  int in_R8D;
  int scalingIndices_2 [1];
  int scalingIndices_1 [1];
  int scalingIndices [2];
  int child2ScalingIndex;
  int child1ScalingIndex;
  int parScalingIndex;
  int sIndex;
  float *scalingFactors;
  int rescale;
  int endPattern;
  int startPattern;
  float *destPartials;
  float *matrices2;
  float *matrices1;
  int *tipStates2;
  int *tipStates1;
  float *partials2;
  float *partials1;
  int currentPartition;
  int child2TransMatIndex;
  int child2Index;
  int child1TransMatIndex;
  int child1Index;
  int readScalingIndex;
  int writeScalingIndex;
  int parIndex;
  int numOps;
  int op;
  float *cumulativeScaleBuffer;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  undefined8 local_a8;
  int local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  long local_78;
  long local_70;
  undefined8 local_68;
  undefined8 local_60;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  undefined8 local_30;
  int local_28;
  int local_24;
  long local_20;
  byte local_11;
  
  local_11 = in_SIL & 1;
  local_30 = 0;
  if (in_R8D != -1) {
    local_30 = *(undefined8 *)(in_RDI[0x17] + (long)in_R8D * 8);
  }
  local_28 = in_R8D;
  local_24 = in_ECX;
  local_20 = in_RDX;
  for (local_34 = 0; local_34 < local_24; local_34 = local_34 + 1) {
    local_38 = 7;
    if ((local_11 & 1) != 0) {
      local_38 = 9;
    }
    local_3c = *(int *)(local_20 + (long)(local_34 * local_38) * 4);
    local_40 = *(int *)(local_20 + (long)(local_34 * local_38 + 1) * 4);
    local_44 = *(int *)(local_20 + (long)(local_34 * local_38 + 2) * 4);
    local_48 = *(int *)(local_20 + (long)(local_34 * local_38 + 3) * 4);
    local_4c = *(int *)(local_20 + (long)(local_34 * local_38 + 4) * 4);
    local_50 = *(int *)(local_20 + (long)(local_34 * local_38 + 5) * 4);
    local_54 = *(int *)(local_20 + (long)(local_34 * local_38 + 6) * 4);
    local_58 = 0;
    if ((local_11 & 1) != 0) {
      local_58 = *(int *)(local_20 + (long)(local_34 * local_38 + 7) * 4);
      local_28 = *(int *)(local_20 + (long)(local_34 * local_38 + 8) * 4);
      if (local_28 == -1) {
        local_30 = 0;
      }
      else {
        local_30 = *(undefined8 *)(in_RDI[0x17] + (long)local_28 * 8);
      }
    }
    local_60 = *(undefined8 *)(in_RDI[0x15] + (long)local_48 * 8);
    local_68 = *(undefined8 *)(in_RDI[0x15] + (long)local_50 * 8);
    local_70 = *(long *)(in_RDI[0x16] + (long)local_48 * 8);
    local_78 = *(long *)(in_RDI[0x16] + (long)local_50 * 8);
    local_80 = *(undefined8 *)(in_RDI[0x1a] + (long)local_4c * 8);
    local_88 = *(undefined8 *)(in_RDI[0x1a] + (long)local_54 * 8);
    local_90 = *(undefined8 *)(in_RDI[0x15] + (long)local_3c * 8);
    local_94 = 0;
    local_98 = *(undefined4 *)((long)in_RDI + 0x14);
    if ((local_11 & 1) != 0) {
      local_94 = *(undefined4 *)(in_RDI[0x11] + (long)local_58 * 4);
      local_98 = *(undefined4 *)(in_RDI[0x11] + (long)(local_58 + 1) * 4);
    }
    local_9c = -1;
    local_a8 = 0;
    if ((in_RDI[0xb] & 0x80U) == 0) {
      if ((in_RDI[0xb] & 0x100U) == 0) {
        if ((in_RDI[0xb] & 0x2000000U) == 0) {
          if (local_40 < 0) {
            if (-1 < local_44) {
              local_9c = 0;
              local_a8 = *(undefined8 *)(in_RDI[0x17] + (long)local_44 * 8);
            }
          }
          else {
            local_9c = 1;
            local_a8 = *(undefined8 *)(in_RDI[0x17] + (long)local_40 * 8);
          }
        }
        else if ((local_70 == 0) && (local_78 == 0)) {
          local_9c = 1;
          (**(code **)(*in_RDI + 0x110))(in_RDI,&local_44,1,local_28);
          local_a8 = *(undefined8 *)(in_RDI[0x17] + (long)local_40 * 8);
        }
      }
      else {
        local_9c = 1;
        local_a8 = *(undefined8 *)(in_RDI[0x17] + (long)(local_3c - (int)in_RDI[2]) * 8);
      }
    }
    else {
      *(undefined4 *)(in_RDI[0x19] + (long)(local_3c - (int)in_RDI[2]) * 4) = 0;
      if ((local_70 == 0) && (local_78 == 0)) {
        local_9c = 2;
      }
    }
    if (local_70 == 0) {
      if (local_78 == 0) {
        if (local_9c == 2) {
          local_ac = local_3c - (int)in_RDI[2];
          (**(code **)(*in_RDI + 0x2c0))
                    (in_RDI,local_90,local_60,local_80,local_68,local_88,
                     in_RDI[0x19] + (long)local_ac * 4);
          if (*(int *)(in_RDI[0x19] + (long)local_ac * 4) != 0) {
            (**(code **)(*in_RDI + 0x2d8))
                      (in_RDI,local_90,*(undefined8 *)(in_RDI[0x18] + (long)local_ac * 8));
          }
        }
        else if (local_9c == 0) {
          (**(code **)(*in_RDI + 0x2b8))
                    (in_RDI,local_90,local_60,local_80,local_68,local_88,local_a8,local_94,local_98)
          ;
        }
        else {
          (**(code **)(*in_RDI + 0x218))
                    (in_RDI,local_90,local_60,local_80,local_68,local_88,local_94,local_98);
          if (local_9c == 1) {
            if ((local_11 & 1) == 0) {
              (**(code **)(*in_RDI + 0x2c8))(in_RDI,local_90,local_a8,local_30,0);
            }
            else {
              (**(code **)(*in_RDI + 0x2d0))(in_RDI,local_90,local_a8,local_30,0,local_58);
            }
          }
        }
      }
      else if (local_9c == 0) {
        (**(code **)(*in_RDI + 0x2a8))
                  (in_RDI,local_90,local_78,local_88,local_60,local_80,local_a8,local_94,local_98);
      }
      else {
        (**(code **)(*in_RDI + 0x210))
                  (in_RDI,local_90,local_78,local_88,local_60,local_80,local_94,local_98);
        if (local_9c == 1) {
          if ((local_11 & 1) == 0) {
            (**(code **)(*in_RDI + 0x2c8))(in_RDI,local_90,local_a8,local_30,0);
          }
          else {
            (**(code **)(*in_RDI + 0x2d0))(in_RDI,local_90,local_a8,local_30,0,local_58);
          }
        }
      }
    }
    else if (local_78 == 0) {
      if (local_9c == 0) {
        (**(code **)(*in_RDI + 0x2a8))
                  (in_RDI,local_90,local_70,local_80,local_68,local_88,local_a8,local_94,local_98);
      }
      else {
        (**(code **)(*in_RDI + 0x210))
                  (in_RDI,local_90,local_70,local_80,local_68,local_88,local_94,local_98);
        if (local_9c == 1) {
          if ((local_11 & 1) == 0) {
            (**(code **)(*in_RDI + 0x2c8))(in_RDI,local_90,local_a8,local_30,0);
          }
          else {
            (**(code **)(*in_RDI + 0x2d0))(in_RDI,local_90,local_a8,local_30,0,local_58);
          }
        }
      }
    }
    else if (local_9c == 0) {
      (**(code **)(*in_RDI + 0x2a0))
                (in_RDI,local_90,local_70,local_80,local_78,local_88,local_a8,local_94,local_98);
    }
    else {
      (**(code **)(*in_RDI + 0x208))
                (in_RDI,local_90,local_70,local_80,local_78,local_88,local_94,local_98);
      if (local_9c == 1) {
        if ((local_11 & 1) == 0) {
          (**(code **)(*in_RDI + 0x2c8))(in_RDI,local_90,local_a8,local_30,0);
        }
        else {
          (**(code **)(*in_RDI + 0x2d0))(in_RDI,local_90,local_a8,local_30,0,local_58);
        }
      }
    }
    if ((in_RDI[0xb] & 0x100U) != 0) {
      local_b0 = local_3c - (int)in_RDI[2];
      local_b4 = local_48 - (int)in_RDI[2];
      local_b8 = local_50 - (int)in_RDI[2];
      if ((local_b4 < 0) || (local_b8 < 0)) {
        if (local_b4 < 0) {
          if (-1 < local_b8) {
            local_c8 = local_b8;
            (**(code **)(*in_RDI + 0x100))(in_RDI,&local_c8,1,local_b0);
          }
        }
        else {
          local_c4 = local_b4;
          (**(code **)(*in_RDI + 0x100))(in_RDI,&local_c4,1,local_b0);
        }
      }
      else {
        local_c0 = local_b4;
        local_bc = local_b8;
        (**(code **)(*in_RDI + 0x100))(in_RDI,&local_c0,2,local_b0);
      }
    }
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::upPartials(bool byPartition,
                                                  const int* operations,
                                                  int count,
                                                  int cumulativeScaleIndex) {

    REALTYPE* cumulativeScaleBuffer = NULL;
    if (cumulativeScaleIndex != BEAGLE_OP_NONE)
        cumulativeScaleBuffer = gScaleBuffers[cumulativeScaleIndex];

    for (int op = 0; op < count; op++) {

        int numOps = BEAGLE_OP_COUNT;
        if (byPartition)
            numOps = BEAGLE_PARTITION_OP_COUNT;

        if (DEBUGGING_OUTPUT) {
            fprintf(stderr, "op[%d] = ", op);
            for (int j = 0; j < numOps; j++) {
                std::cerr << operations[op*numOps+j] << " ";
            }
            fprintf(stderr, "\n");
        }

        const int parIndex = operations[op * numOps];
        const int writeScalingIndex = operations[op * numOps + 1];
        const int readScalingIndex = operations[op * numOps + 2];
        const int child1Index = operations[op * numOps + 3];
        const int child1TransMatIndex = operations[op * numOps + 4];
        const int child2Index = operations[op * numOps + 5];
        const int child2TransMatIndex = operations[op * numOps + 6];
        int currentPartition = 0;
        if (byPartition) {
            currentPartition = operations[op * numOps + 7];
            cumulativeScaleIndex = operations[op * numOps + 8];
            if (cumulativeScaleIndex != BEAGLE_OP_NONE)
                cumulativeScaleBuffer = gScaleBuffers[cumulativeScaleIndex];
            else
                cumulativeScaleBuffer = NULL;
        }

        const REALTYPE* partials1 = gPartials[child1Index];
        const REALTYPE* partials2 = gPartials[child2Index];

        const int* tipStates1 = gTipStates[child1Index];
        const int* tipStates2 = gTipStates[child2Index];

        const REALTYPE* matrices1 = gTransitionMatrices[child1TransMatIndex];
        const REALTYPE* matrices2 = gTransitionMatrices[child2TransMatIndex];

        REALTYPE* destPartials = gPartials[parIndex];

        int startPattern = 0;
        int endPattern = kPatternCount;
        if (byPartition) {
            startPattern = gPatternPartitionsStartPatterns[currentPartition];
            endPattern = gPatternPartitionsStartPatterns[currentPartition + 1];
        }

        int rescale = BEAGLE_OP_NONE;
        REALTYPE* scalingFactors = NULL;

        if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
            gActiveScalingFactors[parIndex - kTipCount] = 0;
            if (tipStates1 == 0 && tipStates2 == 0)
                rescale = 2;
        } else if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS) {
            rescale = 1;
            scalingFactors = gScaleBuffers[parIndex - kTipCount];
        } else if (kFlags & BEAGLE_FLAG_SCALING_DYNAMIC) { // TODO: this is a quick and dirty implementation just so it returns correct results
            if (tipStates1 == 0 && tipStates2 == 0) {
                rescale = 1;
                removeScaleFactors(&readScalingIndex, 1, cumulativeScaleIndex);
                scalingFactors = gScaleBuffers[writeScalingIndex];
            }
        } else if (writeScalingIndex >= 0) {
            rescale = 1;
            scalingFactors = gScaleBuffers[writeScalingIndex];
        } else if (readScalingIndex >= 0) {
            rescale = 0;
            scalingFactors = gScaleBuffers[readScalingIndex];
        }

        if (DEBUGGING_OUTPUT) {
            std::cerr << "Rescale= " << rescale << " writeIndex= " << writeScalingIndex
                     << " readIndex = " << readScalingIndex << "\n";
        }

        if (tipStates1 != NULL) {
            if (tipStates2 != NULL ) {
                if (rescale == 0) { // Use fixed scaleFactors
                    calcStatesStatesFixedScaling(destPartials, tipStates1, matrices1, tipStates2,
                                                 matrices2, scalingFactors, startPattern, endPattern);
                } else {
                    // First compute without any scaling
                    calcStatesStates(destPartials, tipStates1, matrices1, tipStates2, matrices2,
                                     startPattern, endPattern);
                    if (rescale == 1) { // Recompute scaleFactors
                        if (byPartition) {
                            rescalePartialsByPartition(destPartials,scalingFactors,cumulativeScaleBuffer,0, currentPartition);
                        } else {
                            rescalePartials(destPartials,scalingFactors,cumulativeScaleBuffer,0);
                        }
                    }
                }
            } else {
                if (rescale == 0) {
                    calcStatesPartialsFixedScaling(destPartials, tipStates1, matrices1, partials2,
                                                   matrices2, scalingFactors, startPattern, endPattern);
                } else {
                    calcStatesPartials(destPartials, tipStates1, matrices1, partials2, matrices2,
                                       startPattern, endPattern);
                    if (rescale == 1) { // Recompute scaleFactors
                        if (byPartition) {
                            rescalePartialsByPartition(destPartials,scalingFactors,cumulativeScaleBuffer,0, currentPartition);
                        } else {
                            rescalePartials(destPartials,scalingFactors,cumulativeScaleBuffer,0);
                        }
                    }
                }
            }
        } else {
            if (tipStates2 != NULL) {
                if (rescale == 0) {
                    calcStatesPartialsFixedScaling(destPartials,tipStates2,matrices2,partials1,matrices1,
                                                   scalingFactors, startPattern, endPattern);
                } else {
                    calcStatesPartials(destPartials, tipStates2, matrices2, partials1, matrices1,
                                       startPattern, endPattern);
                    if (rescale == 1) {// Recompute scaleFactors
                        if (byPartition) {
                            rescalePartialsByPartition(destPartials,scalingFactors,cumulativeScaleBuffer,0, currentPartition);
                        } else {
                            rescalePartials(destPartials,scalingFactors,cumulativeScaleBuffer,0);
                        }
                    }
                }
            } else {
                if (rescale == 2) {
                    int sIndex = parIndex - kTipCount;
                    calcPartialsPartialsAutoScaling(destPartials,partials1,matrices1,partials2,matrices2,
                                                     &gActiveScalingFactors[sIndex]);
                    if (gActiveScalingFactors[sIndex])
                        autoRescalePartials(destPartials, gAutoScaleBuffers[sIndex]);

                } else if (rescale == 0) {
                    calcPartialsPartialsFixedScaling(destPartials,partials1,matrices1,partials2,
                                                     matrices2,scalingFactors,startPattern,endPattern);
                } else {
                    calcPartialsPartials(destPartials, partials1, matrices1, partials2, matrices2,
                                         startPattern, endPattern);
                    if (rescale == 1) {// Recompute scaleFactors
                        if (byPartition) {
                            rescalePartialsByPartition(destPartials,scalingFactors,cumulativeScaleBuffer,0, currentPartition);
                        } else {
                            rescalePartials(destPartials,scalingFactors,cumulativeScaleBuffer,0);
                        }
                    }
                }
            }
        }

        if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS) {
            int parScalingIndex = parIndex - kTipCount;
            int child1ScalingIndex = child1Index - kTipCount;
            int child2ScalingIndex = child2Index - kTipCount;
            if (child1ScalingIndex >= 0 && child2ScalingIndex >= 0) {
                int scalingIndices[2] = {child1ScalingIndex, child2ScalingIndex};
                accumulateScaleFactors(scalingIndices, 2, parScalingIndex);
            } else if (child1ScalingIndex >= 0) {
                int scalingIndices[1] = {child1ScalingIndex};
                accumulateScaleFactors(scalingIndices, 1, parScalingIndex);
            } else if (child2ScalingIndex >= 0) {
                int scalingIndices[1] = {child2ScalingIndex};
                accumulateScaleFactors(scalingIndices, 1, parScalingIndex);
            }
        }

        if (DEBUGGING_OUTPUT) {
            if (scalingFactors != NULL && rescale == 0) {
                for(int i=0; i<kPatternCount; i++)
                    fprintf(stderr,"old scaleFactor[%d] = %.5f\n",i,scalingFactors[i]);
            }
            fprintf(stderr,"Result partials:\n");
            for(int i = 0; i < kPartialsSize; i++)
                fprintf(stderr,"destP[%d] = %.5f\n",i,destPartials[i]);
        }
    }

    return BEAGLE_SUCCESS;
}